

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::HttpServer::Connection::sendWebSocketError::BrokenWebSocket::disconnect(BrokenWebSocket *this)

{
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar1;
  _func_int **local_178;
  char *pcStack_170;
  Exception local_168;
  
  Exception::Exception(&local_168,(Exception *)(in_RSI + 8));
  heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_178,&local_168);
  (this->super_WebSocket)._vptr_WebSocket = local_178;
  (this->exception).ownFile.content.ptr = pcStack_170;
  Exception::~Exception(&local_168);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> disconnect() override {
        return kj::cp(exception);
      }